

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O0

type_conflict2 jsteemann::atoi<unsigned_long>(char *p,char *e,int *errcode)

{
  int *errcode_local;
  char *e_local;
  char *p_local;
  
  if (p == e) {
    *errcode = -1;
    p_local = (char *)0x0;
  }
  else if (*p == '-') {
    *errcode = -2;
    p_local = (char *)0x0;
  }
  else {
    e_local = p;
    if (*p == '+') {
      e_local = p + 1;
    }
    p_local = (char *)atoi_positive<unsigned_long>(e_local,e,errcode);
  }
  return (type_conflict2)p_local;
}

Assistant:

inline typename std::enable_if<std::is_unsigned<T>::value, T>::type atoi(char const* p, char const* e, int &errcode) JSTEEMANN_NOEXCEPT {
  if (ATOI_UNLIKELY(p == e)) {
    errcode = -1;
    return T();
  }

  if (*p == '-') {
    errcode = -2;
    return T();
  }
  if (ATOI_UNLIKELY(*p == '+')) {
    ++p;
  }

  return atoi_positive<T>(p, e, errcode);
}